

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  byte bVar5;
  size_type sVar6;
  unsigned_long *puVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  reference this_00;
  undefined8 local_198;
  string local_170 [32];
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong local_d0;
  size_t pos;
  unsigned_long local_c0;
  ulong local_b8;
  size_t width;
  size_t tabPos;
  value_type local_a0;
  undefined1 local_80 [8];
  string remainder;
  size_t indent;
  allocator local_41;
  string local_40 [8];
  string wrappableChars;
  TextAttributes *_attr_local;
  string *_str_local;
  Text *this_local;
  
  wrappableChars.field_2._8_8_ = _attr;
  std::__cxx11::string::string((string *)this);
  sVar1 = *(size_t *)wrappableChars.field_2._8_8_;
  sVar2 = *(size_t *)(wrappableChars.field_2._8_8_ + 8);
  uVar3 = *(undefined8 *)(wrappableChars.field_2._8_8_ + 0x18);
  (this->attr).width = *(size_t *)(wrappableChars.field_2._8_8_ + 0x10);
  *(undefined8 *)&(this->attr).tabChar = uVar3;
  (this->attr).initialIndent = sVar1;
  (this->attr).indent = sVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->lines);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40," [({.,/|\\-",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (*(long *)wrappableChars.field_2._8_8_ == -1) {
    local_198 = *(undefined8 *)(wrappableChars.field_2._8_8_ + 8);
  }
  else {
    local_198 = *(undefined8 *)wrappableChars.field_2._8_8_;
  }
  remainder.field_2._8_8_ = local_198;
  std::__cxx11::string::string((string *)local_80,(string *)_str);
  do {
    bVar5 = std::__cxx11::string::empty();
    if (((bVar5 ^ 0xff) & 1) == 0) {
      tabPos._0_4_ = 0;
LAB_0015907d:
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string(local_40);
      return;
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->lines);
    if (999 < sVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a0,"... message truncated due to excessive size",
                 (allocator *)((long)&tabPos + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->lines,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tabPos + 7));
      tabPos._0_4_ = 1;
      goto LAB_0015907d;
    }
    width = 0xffffffffffffffff;
    local_c0 = std::__cxx11::string::size();
    pos = *(long *)(wrappableChars.field_2._8_8_ + 0x10) - remainder.field_2._8_8_;
    puVar7 = std::min<unsigned_long>(&local_c0,&pos);
    local_b8 = *puVar7;
    local_d0 = std::__cxx11::string::find_first_of((char)local_80,10);
    if (local_d0 <= local_b8) {
      local_b8 = local_d0;
    }
    local_d0 = std::__cxx11::string::find_last_of
                         ((char)local_80,
                          (ulong)(uint)(int)*(char *)(wrappableChars.field_2._8_8_ + 0x18));
    if (local_d0 != 0xffffffffffffffff) {
      width = local_d0;
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      if (*pcVar8 == '\n') {
        local_b8 = local_b8 - 1;
      }
      std::__cxx11::string::substr((ulong)&local_110,(ulong)local_80);
      std::__cxx11::string::substr((ulong)&local_130,(ulong)local_80);
      std::operator+(&local_f0,&local_110,&local_130);
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
    }
    uVar4 = local_b8;
    uVar9 = std::__cxx11::string::size();
    if (uVar4 == uVar9) {
      spliceLine(this,remainder.field_2._8_8_,(string *)local_80,local_b8);
    }
    else {
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      if (*pcVar8 == '\n') {
        spliceLine(this,remainder.field_2._8_8_,(string *)local_80,local_b8);
        if ((local_b8 < 2) || (lVar10 = std::__cxx11::string::size(), lVar10 != 1)) {
          std::__cxx11::string::substr((ulong)local_150,(ulong)local_80);
          std::__cxx11::string::operator=((string *)local_80,local_150);
          std::__cxx11::string::~string(local_150);
        }
        remainder.field_2._8_8_ = *(undefined8 *)(wrappableChars.field_2._8_8_ + 8);
      }
      else {
        local_d0 = std::__cxx11::string::find_last_of((string *)local_80,(ulong)local_40);
        if ((local_d0 == 0xffffffffffffffff) || (local_d0 == 0)) {
          spliceLine(this,remainder.field_2._8_8_,(string *)local_80,local_b8 - 1);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::back(&this->lines);
          std::__cxx11::string::operator+=((string *)this_00,"-");
        }
        else {
          spliceLine(this,remainder.field_2._8_8_,(string *)local_80,local_d0);
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
          if (*pcVar8 == ' ') {
            std::__cxx11::string::substr((ulong)local_170,(ulong)local_80);
            std::__cxx11::string::operator=((string *)local_80,local_170);
            std::__cxx11::string::~string(local_170);
          }
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->lines);
        if (sVar6 == 1) {
          remainder.field_2._8_8_ = *(undefined8 *)(wrappableChars.field_2._8_8_ + 8);
        }
        if (width != 0xffffffffffffffff) {
          remainder.field_2._8_8_ = width + remainder.field_2._8_8_;
        }
      }
    }
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }